

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O0

void __thiscall hashset<teaminfo>::clear(hashset<teaminfo> *this)

{
  int local_14;
  int i;
  hashset<teaminfo> *this_local;
  
  if (this->numelems != 0) {
    for (local_14 = 0; local_14 < this->size; local_14 = local_14 + 1) {
      this->chains[local_14] = (chain *)0x0;
    }
    this->numelems = 0;
    this->unused = (chain *)0x0;
    deletechunks(this);
  }
  return;
}

Assistant:

void clear()
    {
        if(!numelems) return;
        loopi(size) chains[i] = NULL;
        numelems = 0;
        unused = NULL;
        deletechunks();
    }